

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<unsigned_int>::vector(vector<unsigned_int> *this,vector<unsigned_int> *other)

{
  vector<unsigned_int> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  increase_capacity(in_RSI,(uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                    SUB81((ulong)in_RDI >> 0x10,0));
  *(uint *)(in_RDI + 1) = in_RSI->m_size;
  memcpy((void *)*in_RDI,in_RSI->m_p,(ulong)*(uint *)(in_RDI + 1) << 2);
  return;
}

Assistant:

inline vector(const vector& other)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(other.m_size, false);

    m_size = other.m_size;

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }
  }